

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedNormalizer.cpp
# Opt level: O2

bool __thiscall Shell::InterpretedNormalizer::apply(InterpretedNormalizer *this,UnitList **units)

{
  Clause *cl_00;
  Clause *pCVar1;
  List<Kernel::Unit_*> **ppLVar2;
  bool bVar3;
  Clause *cl;
  DelIterator uit;
  NFormulaTransformer ftransf;
  FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer> futransf;
  DelIterator local_68;
  undefined **local_50;
  NLiteralTransformer *local_48;
  LocalFormulaUnitTransformer local_40;
  undefined ***local_30;
  
  local_48 = this->_litTransf;
  local_30 = &local_50;
  local_50 = &PTR_transform_00a03df0;
  local_40._rule = THEORY_NORMALIZATION;
  local_40.super_FormulaUnitTransformer._vptr_FormulaUnitTransformer =
       (_func_int **)&PTR__FormulaUnitTransformer_00a03f78;
  local_68._prev = (UnitList *)0x0;
  local_68._cur = (UnitList *)0x0;
  bVar3 = false;
  local_68._lst = units;
LAB_005589c1:
  do {
    ppLVar2 = &(local_68._cur)->_tail;
    if (local_68._cur == (UnitList *)0x0) {
      ppLVar2 = local_68._lst;
    }
    if (*ppLVar2 == (List<Kernel::Unit_*> *)0x0) {
      return bVar3;
    }
    ppLVar2 = local_68._lst;
    if (local_68._cur != (UnitList *)0x0) {
      ppLVar2 = &(local_68._cur)->_tail;
      local_68._prev = local_68._cur;
    }
    local_68._cur = *ppLVar2;
    cl_00 = (Clause *)(local_68._cur)->_head;
    if (((cl_00->super_Unit).field_0x4 & 1) != 0) goto LAB_00558a13;
    pCVar1 = apply(this,cl_00);
  } while (cl_00 == pCVar1);
  if (pCVar1 != (Clause *)0x0) goto LAB_00558a23;
  Lib::List<Kernel::Unit_*>::DelIterator::del(&local_68);
  goto LAB_00558a2b;
LAB_00558a13:
  pCVar1 = (Clause *)Kernel::LocalFormulaUnitTransformer::transform(&local_40,(FormulaUnit *)cl_00);
  if (cl_00 != pCVar1) {
LAB_00558a23:
    (local_68._cur)->_head = &pCVar1->super_Unit;
LAB_00558a2b:
    bVar3 = true;
  }
  goto LAB_005589c1;
}

Assistant:

bool InterpretedNormalizer::apply(UnitList*& units)
{
  NFormulaTransformer ftransf(_litTransf);
  FTFormulaUnitTransformer<NFormulaTransformer> futransf(InferenceRule::THEORY_NORMALIZATION, ftransf);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      Clause* cl = static_cast<Clause*>(u);
      Clause* cl1 = apply(cl);
      if(cl!=cl1) {
	if(cl1) {
	  uit.replace(cl1);
	}
	else {
	  uit.del();
	}
	modified = true;
      }
    }
    else {
      FormulaUnit* fu = static_cast<FormulaUnit*>(u);
      FormulaUnit* fu1 = futransf.transform(fu);
      if(fu!=fu1) {
	      uit.replace(fu1);
	      modified = true;
      }
    }
  }
  return modified;
}